

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O1

err_t cmdCVCsVal(octet *certs,size_t certs_len,octet *date)

{
  err_t eVar1;
  bool_t bVar2;
  btok_cvc_t *cvc;
  size_t sVar3;
  octet *date_00;
  octet *der;
  size_t count;
  
  if (certs_len == 0) {
    eVar1 = 0;
  }
  else {
    cvc = (btok_cvc_t *)blobCreate(0x250);
    if (cvc == (btok_cvc_t *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      sVar3 = btokCVCLen(certs,certs_len);
      if (sVar3 == 0xffffffffffffffff) {
LAB_00103c89:
        eVar1 = 0x202;
      }
      else {
        eVar1 = btokCVCUnwrap(cvc,certs,sVar3,(octet *)0x0,0);
        if (eVar1 == 0) {
          eVar1 = 0;
          count = certs_len - sVar3;
          if (count != 0) {
            der = certs + sVar3;
            do {
              sVar3 = btokCVCLen(der,count);
              if (sVar3 == 0xffffffffffffffff) goto LAB_00103c89;
              if (((date == (octet *)0x0) || (count != sVar3)) ||
                 (bVar2 = memIsZero(date,6), date_00 = date, bVar2 != 0)) {
                date_00 = (octet *)0x0;
              }
              eVar1 = btokCVCVal2(cvc + 1,der,sVar3,cvc,date_00);
              if (eVar1 != 0) goto LAB_00103c8f;
              der = der + sVar3;
              memCopy(cvc,cvc + 1,0x128);
              count = count - sVar3;
            } while (count != 0);
            eVar1 = 0;
          }
        }
      }
LAB_00103c8f:
      blobClose(cvc);
    }
  }
  return eVar1;
}

Assistant:

err_t cmdCVCsVal(const octet* certs, size_t certs_len, const octet date[6])
{
	err_t code;
	void* stack;
	size_t len;
	btok_cvc_t* cvca;
	btok_cvc_t* cvc;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsNullOrValid(date, 6));
	// пустая цепочка?
	if (!certs_len)
		return ERR_OK;
	// выделить и разметить память
	code = cmdBlobCreate(stack, 2 * sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cvca = (btok_cvc_t*)stack;
	cvc = cvca + 1;
	// найти и разобрать первый сертификат
	len = btokCVCLen(certs, certs_len);
	if (len == SIZE_MAX)
		code = ERR_BAD_CERT;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	code = btokCVCUnwrap(cvca, certs, len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	certs_len -= len, certs += len;
	// цикл по остальным сертификатам
	while (certs_len)
	{
		// разобрать сертификат
		len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			code = ERR_BAD_CERT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить сертификат
		if (len == certs_len && date && !memIsZero(date, 6))
			code = btokCVCVal2(cvc, certs, len, cvca, date);
		else
			code = btokCVCVal2(cvc, certs, len, cvca, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// к следующему сертификату
		certs_len -= len, certs += len;
		// издатель <- эмитент
		memCopy(cvca, cvc, sizeof(btok_cvc_t));
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}